

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

DivideBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_dividebroadcastable
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  DivideBroadcastableLayerParams *pDVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_dividebroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_dividebroadcastable(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pDVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::DivideBroadcastableLayerParams>(arena);
    (this->layer_).dividebroadcastable_ = pDVar2;
  }
  return (DivideBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::DivideBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_dividebroadcastable() {
  if (!_internal_has_dividebroadcastable()) {
    clear_layer();
    set_has_dividebroadcastable();
    layer_.dividebroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::DivideBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.dividebroadcastable_;
}